

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteControllerLibrary(ColladaExporter *this)

{
  ostream *poVar1;
  size_t a;
  ulong pIndex;
  
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"<library_controllers>");
  std::operator<<(poVar1,(string *)&this->endstr);
  PushTag(this);
  for (pIndex = 0; pIndex < this->mScene->mNumMeshes; pIndex = pIndex + 1) {
    WriteController(this,pIndex);
  }
  PopTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"</library_controllers>");
  std::operator<<(poVar1,(string *)&this->endstr);
  return;
}

Assistant:

void ColladaExporter::WriteControllerLibrary()
{
    mOutput << startstr << "<library_controllers>" << endstr;
    PushTag();
    
    for( size_t a = 0; a < mScene->mNumMeshes; ++a) {
        WriteController( a);
    }

    PopTag();
    mOutput << startstr << "</library_controllers>" << endstr;
}